

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperSwitch.c
# Opt level: O0

float Map_SwitchCutRefDeref(Map_Node_t *pNode,Map_Cut_t *pCut,int fPhase,int fReference)

{
  Map_Node_t *pNode_00;
  int iVar1;
  float fVar2;
  uint local_44;
  int local_40;
  int fPhaseChild;
  int i;
  float aSwitchActivity;
  Map_Cut_t *pCutChild;
  Map_Node_t *pNodeChild;
  int fReference_local;
  int fPhase_local;
  Map_Cut_t *pCut_local;
  Map_Node_t *pNode_local;
  
  fPhaseChild = (int)pNode->Switching;
  pNode_local._4_4_ = (float)fPhaseChild;
  if (pCut->nLeaves != '\x01') {
    if (pCut->M[fPhase].pSuperBest == (Map_Super_t *)0x0) {
      __assert_fail("pCut->M[fPhase].pSuperBest",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mapper/mapperSwitch.c"
                    ,0x71,"float Map_SwitchCutRefDeref(Map_Node_t *, Map_Cut_t *, int, int)");
    }
    for (local_40 = 0; local_40 < pCut->nLeaves; local_40 = local_40 + 1) {
      pNode_00 = pCut->ppLeaves[local_40];
      local_44 = Map_CutGetLeafPhase(pCut,fPhase,local_40);
      if (fReference == 0) {
        if ((pNode_00->pCutBest[0] == (Map_Cut_t *)0x0) ||
           (pNode_00->pCutBest[1] == (Map_Cut_t *)0x0)) {
          iVar1 = pNode_00->nRefAct[(int)local_44] + -1;
          pNode_00->nRefAct[(int)local_44] = iVar1;
          if ((iVar1 == 0) && (pNode_00->pCutBest[(int)local_44] == (Map_Cut_t *)0x0)) {
            fPhaseChild = (int)(pNode_00->Switching + (float)fPhaseChild);
          }
          iVar1 = pNode_00->nRefAct[2] + -1;
          pNode_00->nRefAct[2] = iVar1;
        }
        else {
          pNode_00->nRefAct[2] = pNode_00->nRefAct[2] + -1;
          iVar1 = pNode_00->nRefAct[(int)local_44] + -1;
          pNode_00->nRefAct[(int)local_44] = iVar1;
        }
        if (iVar1 < 1) {
          if (pNode_00->nRefAct[(int)local_44] < 0) {
            __assert_fail("pNodeChild->nRefAct[fPhaseChild] >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mapper/mapperSwitch.c"
                          ,0x9f,"float Map_SwitchCutRefDeref(Map_Node_t *, Map_Cut_t *, int, int)");
          }
          goto LAB_0040f7ad;
        }
      }
      else {
        if ((pNode_00->pCutBest[0] == (Map_Cut_t *)0x0) ||
           (pNode_00->pCutBest[1] == (Map_Cut_t *)0x0)) {
          iVar1 = pNode_00->nRefAct[(int)local_44];
          pNode_00->nRefAct[(int)local_44] = iVar1 + 1;
          if ((iVar1 == 0) && (pNode_00->pCutBest[(int)local_44] == (Map_Cut_t *)0x0)) {
            fPhaseChild = (int)(pNode_00->Switching + (float)fPhaseChild);
          }
          iVar1 = pNode_00->nRefAct[2];
          pNode_00->nRefAct[2] = iVar1 + 1;
        }
        else {
          pNode_00->nRefAct[2] = pNode_00->nRefAct[2] + 1;
          iVar1 = pNode_00->nRefAct[(int)local_44];
          pNode_00->nRefAct[(int)local_44] = iVar1 + 1;
        }
        if (iVar1 < 1) {
LAB_0040f7ad:
          _i = pNode_00->pCutBest[(int)local_44];
          if (_i == (Map_Cut_t *)0x0) {
            local_44 = (uint)((local_44 != 0 ^ 0xffU) & 1);
            _i = pNode_00->pCutBest[(int)local_44];
          }
          fVar2 = Map_SwitchCutRefDeref(pNode_00,_i,local_44,fReference);
          fPhaseChild = (int)(fVar2 + (float)fPhaseChild);
        }
      }
    }
    pNode_local._4_4_ = (float)fPhaseChild;
  }
  return pNode_local._4_4_;
}

Assistant:

float Map_SwitchCutRefDeref( Map_Node_t * pNode, Map_Cut_t * pCut, int fPhase, int fReference )
{
    Map_Node_t * pNodeChild;
    Map_Cut_t * pCutChild;
    float aSwitchActivity;
    int i, fPhaseChild;

    // start switching activity for the node
    aSwitchActivity = pNode->Switching;
    // consider the elementary variable
    if ( pCut->nLeaves == 1 )
        return aSwitchActivity;

    // go through the children
    assert( pCut->M[fPhase].pSuperBest );
    for ( i = 0; i < pCut->nLeaves; i++ )
    {
        pNodeChild  = pCut->ppLeaves[i];
        fPhaseChild = Map_CutGetLeafPhase( pCut, fPhase, i );
        // get the reference counter of the child

        if ( fReference )
        {
            if ( pNodeChild->pCutBest[0] && pNodeChild->pCutBest[1] ) // both phases are present
            {
                // if this phase of the node is referenced, there is no recursive call
                pNodeChild->nRefAct[2]++;
                if ( pNodeChild->nRefAct[fPhaseChild]++ > 0 )
                    continue;
            }
            else // only one phase is present
            {
                // inverter should be added if the phase
                // (a) has no reference and (b) is implemented using other phase
                if ( pNodeChild->nRefAct[fPhaseChild]++ == 0 && pNodeChild->pCutBest[fPhaseChild] == NULL )
                    aSwitchActivity += pNodeChild->Switching; // inverter switches the same as the node
                // if the node is referenced, there is no recursive call
                if ( pNodeChild->nRefAct[2]++ > 0 )
                    continue;
            }
        }
        else
        {
            if ( pNodeChild->pCutBest[0] && pNodeChild->pCutBest[1] ) // both phases are present
            {
                // if this phase of the node is referenced, there is no recursive call
                --pNodeChild->nRefAct[2];
                if ( --pNodeChild->nRefAct[fPhaseChild] > 0 )
                    continue;
            }
            else // only one phase is present
            {
                // inverter should be added if the phase
                // (a) has no reference and (b) is implemented using other phase
                if ( --pNodeChild->nRefAct[fPhaseChild] == 0 && pNodeChild->pCutBest[fPhaseChild] == NULL )
                    aSwitchActivity += pNodeChild->Switching; // inverter switches the same as the node
                // if the node is referenced, there is no recursive call
                if ( --pNodeChild->nRefAct[2] > 0 )
                    continue;
            }
            assert( pNodeChild->nRefAct[fPhaseChild] >= 0 );
        }

        // get the child cut
        pCutChild = pNodeChild->pCutBest[fPhaseChild];
        // if the child does not have this phase mapped, take the opposite phase
        if ( pCutChild == NULL )
        {
            fPhaseChild = !fPhaseChild;
            pCutChild   = pNodeChild->pCutBest[fPhaseChild];
        }
        // reference and compute area recursively
        aSwitchActivity += Map_SwitchCutRefDeref( pNodeChild, pCutChild, fPhaseChild, fReference );
    }
    return aSwitchActivity;
}